

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall server_response::add_waiting_task_id(server_response *this,int id_task)

{
  common_log *log;
  __hashtable *__h;
  unique_lock<std::mutex> lock;
  __node_gen_type __node_gen;
  int local_34;
  unique_lock<std::mutex> local_30;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_20;
  
  local_34 = id_task;
  if (0 < common_log_verbosity_thold) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                   "srv  %12.*s: add task %d to waiting list. current waiting = %d (before add)\n",
                   0xc,"add_waiting_task_id",(ulong)(uint)id_task,
                   (int)(this->waiting_task_ids)._M_h._M_element_count);
  }
  local_30._M_device = &this->mutex_results;
  local_30._M_owns = false;
  httplib::detail::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  local_20 = &this->waiting_task_ids;
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_20,&local_34);
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void add_waiting_task_id(int id_task) {
        SRV_DBG("add task %d to waiting list. current waiting = %d (before add)\n", id_task, (int) waiting_task_ids.size());

        std::unique_lock<std::mutex> lock(mutex_results);
        waiting_task_ids.insert(id_task);
    }